

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O1

void __thiscall amrex::AmrLevel::restart(AmrLevel *this,Amr *papa,istream *is,bool bReadSpecial)

{
  BoxArray *this_00;
  undefined8 uVar1;
  int iVar2;
  pointer pIVar3;
  FabFactory<amrex::FArrayBox> *pFVar4;
  pointer pSVar5;
  void *pvVar6;
  int iVar7;
  IndexSpace *pIVar8;
  FabFactory<amrex::FArrayBox> *pFVar9;
  StateDescriptor *d;
  long lVar10;
  size_type sVar11;
  initializer_list<int> __l;
  allocator_type local_99;
  FabFactory<amrex::FArrayBox> *local_98;
  Geometry *local_90;
  DistributionMapping *local_88;
  Amr *local_80;
  size_type local_78;
  vector<int,_std::allocator<int>_> local_70;
  Vector<int,_std::allocator<int>_> state_in_checkpoint;
  int nstate;
  int local_3c;
  undefined4 local_38;
  undefined4 local_34;
  
  this->parent = papa;
  local_80 = papa;
  std::istream::operator>>((istream *)is,&this->level);
  local_90 = &this->geom;
  amrex::operator>>(is,local_90);
  (this->fine_ratio).vect[0] = 1;
  (this->fine_ratio).vect[1] = 1;
  (this->fine_ratio).vect[2] = 1;
  (this->fine_ratio).vect[0] = -1;
  uVar1 = *(undefined8 *)((this->fine_ratio).vect + 1);
  *(ulong *)((this->fine_ratio).vect + 1) = CONCAT44(-(int)((ulong)uVar1 >> 0x20),-(int)uVar1);
  (this->crse_ratio).vect[0] = 1;
  (this->crse_ratio).vect[1] = 1;
  (this->crse_ratio).vect[2] = 1;
  (this->crse_ratio).vect[0] = -1;
  uVar1 = *(undefined8 *)((this->crse_ratio).vect + 1);
  *(ulong *)((this->crse_ratio).vect + 1) = CONCAT44(-(int)((ulong)uVar1 >> 0x20),-(int)uVar1);
  iVar7 = this->level;
  lVar10 = (long)iVar7;
  if (0 < lVar10) {
    pIVar3 = (this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar2 = pIVar3[lVar10 + -1].vect[2];
    *(undefined8 *)(this->crse_ratio).vect = *(undefined8 *)pIVar3[lVar10 + -1].vect;
    (this->crse_ratio).vect[2] = iVar2;
  }
  if (iVar7 < (this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
    pIVar3 = (this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
             super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
             super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar7 = pIVar3[lVar10].vect[2];
    *(undefined8 *)(this->fine_ratio).vect = *(undefined8 *)pIVar3[lVar10].vect;
    (this->fine_ratio).vect[2] = iVar7;
  }
  this_00 = &this->grids;
  if (bReadSpecial) {
    readBoxArray(this_00,is,true);
  }
  else {
    BoxArray::readFrom(this_00,is);
  }
  std::istream::operator>>((istream *)is,&nstate);
  iVar7 = DescriptorList::size((DescriptorList *)desc_lst);
  sVar11 = (size_type)iVar7;
  local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
  _0_4_ = 1;
  std::vector<int,_std::allocator<int>_>::vector
            (&state_in_checkpoint.super_vector<int,_std::allocator<int>_>,sVar11,
             (value_type_conflict *)&local_70,(allocator_type *)&local_3c);
  local_78 = sVar11;
  if (nstate < iVar7) {
    (*this->_vptr_AmrLevel[0xc])(this,&state_in_checkpoint);
  }
  local_88 = &this->dmap;
  DistributionMapping::define(local_88,this_00,*(int *)(ParallelContext::frames + 0x10));
  AmrMesh::SetBoxArray((AmrMesh *)this->parent,this->level,this_00);
  AmrMesh::SetDistributionMap((AmrMesh *)this->parent,this->level,local_88);
  pIVar8 = EB2::TopIndexSpaceIfPresent();
  if (pIVar8 == (IndexSpace *)0x0) {
    pFVar9 = (FabFactory<amrex::FArrayBox> *)operator_new(8);
    pFVar9->_vptr_FabFactory = (_func_int **)&PTR__FabFactory_008378d0;
    pFVar4 = (this->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
    (this->m_factory)._M_t.
    super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl = pFVar9;
    if (pFVar4 != (FabFactory<amrex::FArrayBox> *)0x0) {
      (*pFVar4->_vptr_FabFactory[1])();
    }
  }
  else {
    local_3c = m_eb_basic_grow_cells;
    local_38 = m_eb_volume_grow_cells;
    local_34 = m_eb_full_grow_cells;
    __l._M_len = 3;
    __l._M_array = &local_3c;
    std::vector<int,_std::allocator<int>_>::vector(&local_70,__l,&local_99);
    makeEBFabFactory((amrex *)&local_98,local_90,this_00,local_88,
                     (Vector<int,_std::allocator<int>_> *)&local_70,m_eb_support_level);
    pFVar9 = local_98;
    local_98 = (FabFactory<amrex::FArrayBox> *)0x0;
    pFVar4 = (this->m_factory)._M_t.
             super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
    (this->m_factory)._M_t.
    super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl = pFVar9;
    if (pFVar4 != (FabFactory<amrex::FArrayBox> *)0x0) {
      (*pFVar4->_vptr_FabFactory[1])();
    }
    if (local_98 != (FabFactory<amrex::FArrayBox> *)0x0) {
      (**(code **)(*(long *)local_98 + 8))();
    }
    local_98 = (FabFactory<amrex::FArrayBox> *)0x0;
    pvVar6 = (void *)CONCAT44(local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._4_4_,
                              local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start._0_4_);
    if (pvVar6 != (void *)0x0) {
      operator_delete(pvVar6,(long)local_70.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage - (long)pvVar6);
    }
  }
  std::vector<amrex::StateData,_std::allocator<amrex::StateData>_>::resize
            (&(this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>,
             local_78);
  local_90 = (Geometry *)this_00;
  if (0 < iVar7) {
    local_80 = (Amr *)&local_80->restart_chkfile;
    sVar11 = 0;
    do {
      if (state_in_checkpoint.super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [sVar11] != 0) {
        pSVar5 = (this->state).super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                 super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pFVar4 = (this->m_factory)._M_t.
                 super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                 .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
        d = DescriptorList::operator[]((DescriptorList *)desc_lst,(int)sVar11);
        StateData::restart(pSVar5 + sVar11,is,&(this->geom).domain,(BoxArray *)local_90,local_88,
                           pFVar4,d,(string *)local_80);
      }
      sVar11 = sVar11 + 1;
    } while (sVar11 != local_78);
  }
  if ((this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_coarse_grids != false) {
    constructAreaNotToTag(this);
  }
  this->post_step_regrid = 0;
  if (state_in_checkpoint.super_vector<int,_std::allocator<int>_>.
      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(state_in_checkpoint.super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)state_in_checkpoint.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)state_in_checkpoint.super_vector<int,_std::allocator<int>_>.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void
AmrLevel::restart (Amr&          papa,
                   std::istream& is,
                   bool          bReadSpecial)
{
    BL_PROFILE("AmrLevel::restart()");
    parent = &papa;

    is >> level;
    is >> geom;

    fine_ratio = IntVect::TheUnitVector(); fine_ratio.scale(-1);
    crse_ratio = IntVect::TheUnitVector(); crse_ratio.scale(-1);

    if (level > 0)
    {
        crse_ratio = parent->refRatio(level-1);
    }
    if (level < parent->maxLevel())
    {
        fine_ratio = parent->refRatio(level);
    }

    if (bReadSpecial)
    {
        amrex::readBoxArray(grids, is, bReadSpecial);
    }
    else
    {
        grids.readFrom(is);
    }

    int nstate;
    is >> nstate;
    int ndesc = desc_lst.size();

    Vector<int> state_in_checkpoint(ndesc, 1);
    if (ndesc > nstate) {
        set_state_in_checkpoint(state_in_checkpoint);
    } else {
        BL_ASSERT(nstate == ndesc);
    }

    dmap.define(grids);

    parent->SetBoxArray(level, grids);
    parent->SetDistributionMap(level, dmap);

#ifdef AMREX_USE_EB
    if (EB2::TopIndexSpaceIfPresent()) {
        m_factory = makeEBFabFactory(geom, grids, dmap,
                                     {m_eb_basic_grow_cells,
                                      m_eb_volume_grow_cells,
                                      m_eb_full_grow_cells},
                                     m_eb_support_level);
    } else
#endif
    {
        m_factory = std::make_unique<FArrayBoxFactory>();
    }

    state.resize(ndesc);
    for (int i = 0; i < ndesc; ++i)
    {
        if (state_in_checkpoint[i]) {
            state[i].restart(is, geom.Domain(), grids, dmap, *m_factory,
                             desc_lst[i], papa.theRestartFile());
        }
    }

    if (parent->useFixedCoarseGrids()) constructAreaNotToTag();

    post_step_regrid = 0;

    finishConstructor();
}